

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hop.h
# Opt level: O1

Hop_Obj_t * Hop_ManFetchMemory(Hop_Man_t *p)

{
  uint uVar1;
  Hop_Obj_t *pHVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  int iVar5;
  
  if (p->pListFree == (Hop_Obj_t *)0x0) {
    Hop_ManAddMemory(p);
  }
  pHVar2 = p->pListFree;
  p->pListFree = (Hop_Obj_t *)pHVar2->field_0;
  pHVar2->pFanin0 = (Hop_Obj_t *)0x0;
  pHVar2->pFanin1 = (Hop_Obj_t *)0x0;
  (pHVar2->field_0).pData = (void *)0x0;
  (pHVar2->field_1).pNext = (Hop_Obj_t *)0x0;
  *(undefined8 *)&pHVar2->field_0x20 = 0;
  pVVar3 = p->vObjs;
  if (pVVar3 == (Vec_Ptr_t *)0x0) goto LAB_007ace8e;
  if (p->nCreated != pVVar3->nSize) {
    __assert_fail("p->nCreated == Vec_PtrSize(p->vObjs)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/hop/hop.h"
                  ,0xf0,"Hop_Obj_t *Hop_ManFetchMemory(Hop_Man_t *)");
  }
  uVar1 = pVVar3->nCap;
  if (pVVar3->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc(0x80);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,0x80);
      }
      pVVar3->pArray = ppvVar4;
      iVar5 = 0x10;
    }
    else {
      iVar5 = uVar1 * 2;
      if (iVar5 <= (int)uVar1) goto LAB_007ace7b;
      if (pVVar3->pArray == (void **)0x0) {
        ppvVar4 = (void **)malloc((ulong)uVar1 << 4);
      }
      else {
        ppvVar4 = (void **)realloc(pVVar3->pArray,(ulong)uVar1 << 4);
      }
      pVVar3->pArray = ppvVar4;
    }
    pVVar3->nCap = iVar5;
  }
LAB_007ace7b:
  iVar5 = pVVar3->nSize;
  pVVar3->nSize = iVar5 + 1;
  pVVar3->pArray[iVar5] = pHVar2;
LAB_007ace8e:
  iVar5 = p->nCreated;
  p->nCreated = iVar5 + 1;
  pHVar2->Id = iVar5;
  return pHVar2;
}

Assistant:

static inline Hop_Obj_t * Hop_ManFetchMemory( Hop_Man_t * p )  
{ 
    Hop_Obj_t * pTemp;
    if ( p->pListFree == NULL )
        Hop_ManAddMemory( p );
    pTemp = p->pListFree;
    p->pListFree = *((Hop_Obj_t **)pTemp);
    memset( pTemp, 0, sizeof(Hop_Obj_t) ); 
    if ( p->vObjs )
    {
        assert( p->nCreated == Vec_PtrSize(p->vObjs) );
        Vec_PtrPush( p->vObjs, pTemp );
    }
    pTemp->Id = p->nCreated++;
    return pTemp;
}